

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

pointer __thiscall
slang::SmallVectorBase<(anonymous_namespace)::Constructable>::
emplaceRealloc<(anonymous_namespace)::Constructable>
          (SmallVectorBase<(anonymous_namespace)::Constructable> *this,pointer pos,
          Constructable *args)

{
  pointer pCVar1;
  ulong uVar2;
  size_type sVar3;
  int iVar4;
  pointer pCVar5;
  ulong uVar6;
  uint uVar7;
  pointer ctx;
  int iVar8;
  int *piVar9;
  pointer pCVar10;
  long lVar11;
  long lVar12;
  
  if (this->len != 0xfffffffffffffff) {
    uVar6 = this->len + 1;
    uVar2 = this->cap;
    if (uVar6 < uVar2 * 2) {
      uVar6 = uVar2 * 2;
    }
    if (0xfffffffffffffff - uVar2 < uVar2) {
      uVar6 = 0xfffffffffffffff;
    }
    lVar12 = (long)pos - (long)this->data_;
    pCVar5 = (pointer)operator_new(uVar6 * 8);
    *(undefined1 *)((long)pCVar5 + lVar12) = 1;
    *(int *)((long)pCVar5 + lVar12 + 4) = args->value;
    args->value = 0;
    ctx = this->data_;
    sVar3 = this->len;
    pCVar1 = ctx + sVar3;
    if (pCVar1 == pos) {
      iVar4 = (anonymous_namespace)::Constructable::numConstructorCalls + 1;
      iVar8 = (anonymous_namespace)::Constructable::numMoveConstructorCalls + 1;
      if (sVar3 != 0) {
        iVar8 = -1;
        lVar11 = 0;
        do {
          (&pCVar5->constructed)[lVar11] = true;
          *(undefined4 *)((long)&pCVar5->value + lVar11) =
               *(undefined4 *)((long)&ctx->value + lVar11);
          *(undefined4 *)((long)&ctx->value + lVar11) = 0;
          lVar11 = lVar11 + 8;
          iVar8 = iVar8 + -1;
        } while (sVar3 << 3 != lVar11);
        iVar4 = (anonymous_namespace)::Constructable::numConstructorCalls - iVar8;
        iVar8 = (anonymous_namespace)::Constructable::numMoveConstructorCalls - iVar8;
      }
    }
    else {
      iVar4 = (anonymous_namespace)::Constructable::numConstructorCalls + 1;
      iVar8 = (anonymous_namespace)::Constructable::numMoveConstructorCalls + 1;
      if (ctx != pos) {
        iVar8 = -1;
        pCVar10 = pCVar5;
        do {
          pCVar10->constructed = true;
          pCVar10->value = ctx->value;
          ctx->value = 0;
          ctx = ctx + 1;
          pCVar10 = pCVar10 + 1;
          iVar8 = iVar8 + -1;
        } while (ctx != pos);
        iVar4 = (anonymous_namespace)::Constructable::numConstructorCalls - iVar8;
        iVar8 = (anonymous_namespace)::Constructable::numMoveConstructorCalls - iVar8;
      }
      (anonymous_namespace)::Constructable::numMoveConstructorCalls = iVar8;
      (anonymous_namespace)::Constructable::numConstructorCalls = iVar4;
      piVar9 = (int *)((long)pCVar5 + lVar12 + 0xc);
      ctx = (pointer)0x0;
      do {
        *(undefined1 *)(piVar9 + -1) = 1;
        *piVar9 = pos->value;
        pos->value = 0;
        pos = pos + 1;
        piVar9 = piVar9 + 2;
        uVar7 = (int)ctx - 1;
        ctx = (pointer)(ulong)uVar7;
      } while (pos != pCVar1);
      iVar4 = (anonymous_namespace)::Constructable::numConstructorCalls - uVar7;
      iVar8 = (anonymous_namespace)::Constructable::numMoveConstructorCalls - uVar7;
    }
    (anonymous_namespace)::Constructable::numMoveConstructorCalls = iVar8;
    (anonymous_namespace)::Constructable::numConstructorCalls = iVar4;
    cleanup(this,(EVP_PKEY_CTX *)ctx);
    this->len = this->len + 1;
    this->cap = uVar6;
    this->data_ = pCVar5;
    return (pointer)((long)pCVar5 + lVar12);
  }
  detail::throwLengthError();
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}